

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib571.c
# Opt level: O3

size_t rtp_write(void *ptr,size_t size,size_t nmemb,void *stream)

{
  long *__s2;
  uint uVar1;
  undefined1 uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong __n;
  
  uVar2 = *(undefined1 *)((long)ptr + 1);
  uVar3 = *(ushort *)((long)ptr + 2) << 8 | *(ushort *)((long)ptr + 2) >> 8;
  sVar6 = (size_t)(nmemb == 0 || size == 0);
  uVar4 = curlx_uztosi(nmemb * size);
  uVar1 = uVar4 - 4;
  curl_mprintf("RTP: message size %d, channel %d\n",uVar1,uVar2);
  if (uVar1 == uVar3) {
    if (4 < uVar4) {
      uVar7 = 0;
      __n = (ulong)uVar3;
      do {
        __s2 = (long *)((long)ptr + uVar7 + 4);
        if ((long)__n < 0xd) {
          iVar5 = bcmp("$_1234\n",__s2,__n);
          if (iVar5 != 0) {
            curl_mprintf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",__n & 0xffffffff,__s2);
            return sVar6;
          }
        }
        else if ((int)__s2[1] != 0x66647361 || *__s2 != 0xa343332315f24) {
          curl_mprintf("RTP PAYLOAD CORRUPTED [%s]\n",__s2);
          return sVar6;
        }
        uVar7 = uVar7 + 0xc;
        __n = __n - 0xc;
      } while (uVar7 < uVar3);
    }
    rtp_packet_count = rtp_packet_count + 1;
    curl_mfprintf(_stderr,"packet count is %d\n");
    sVar6 = nmemb * size;
  }
  else {
    curl_mprintf("RTP embedded size (%d) does not match the write size (%d).\n",(uint)uVar3,uVar1);
  }
  return sVar6;
}

Assistant:

static size_t rtp_write(void *ptr, size_t size, size_t nmemb, void *stream)
{
  char *data = (char *)ptr;
  int channel = RTP_PKT_CHANNEL(data);
  int message_size;
  int coded_size = RTP_PKT_LENGTH(data);
  size_t failure = (size && nmemb) ? 0 : 1;
  int i;
  (void)stream;

  message_size = curlx_uztosi(size * nmemb) - 4;

  printf("RTP: message size %d, channel %d\n", message_size, channel);
  if(message_size != coded_size) {
    printf("RTP embedded size (%d) does not match the write size (%d).\n",
           coded_size, message_size);
    return failure;
  }

  data += 4;
  for(i = 0; i < message_size; i += RTP_DATA_SIZE) {
    if(message_size - i > RTP_DATA_SIZE) {
      if(memcmp(RTP_DATA, data + i, RTP_DATA_SIZE) != 0) {
        printf("RTP PAYLOAD CORRUPTED [%s]\n", data + i);
        return failure;
      }
    }
    else {
      if(memcmp(RTP_DATA, data + i, message_size - i) != 0) {
        printf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",
               message_size - i, data + i);
        return failure;
      }
    }
  }

  rtp_packet_count++;
  fprintf(stderr, "packet count is %d\n", rtp_packet_count);

  return size * nmemb;
}